

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O0

void __thiscall DataFileTest::testWrite(DataFileTest *this)

{
  size_t __n;
  void *__buf;
  undefined1 *puVar1;
  long *in_RDI;
  ComplexInteger c;
  int i;
  int64_t im;
  int64_t re;
  DataFileWriter<Complex<long>_> df;
  undefined1 local_38 [12];
  Codec in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar2;
  ValidSchema *in_stack_ffffffffffffffe0;
  long i_00;
  char *in_stack_ffffffffffffffe8;
  long r;
  DataFileWriter<Complex<long>_> in_stack_fffffffffffffff0;
  
  puVar1 = (undefined1 *)*in_RDI;
  __n = 100;
  avro::DataFileWriter<Complex<long>_>::DataFileWriter
            ((DataFileWriter<Complex<long>_> *)in_stack_fffffffffffffff0.base_._M_ptr,
             in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4
            );
  r = 3;
  i_00 = 5;
  for (iVar2 = 0; iVar2 < 1000; iVar2 = iVar2 + 1) {
    Complex<long>::Complex((Complex<long> *)local_38,r,i_00);
    puVar1 = local_38;
    avro::DataFileWriter<Complex<long>_>::write
              ((DataFileWriter<Complex<long>_> *)&stack0xfffffffffffffff0,(int)puVar1,__buf,__n);
    r = i_00 * r;
    i_00 = i_00 + 3;
  }
  avro::DataFileWriter<Complex<long>_>::close
            ((DataFileWriter<Complex<long>_> *)&stack0xfffffffffffffff0,(int)puVar1);
  avro::DataFileWriter<Complex<long>_>::~DataFileWriter((DataFileWriter<Complex<long>_> *)0x247bef);
  return;
}

Assistant:

void testWrite() {
        avro::DataFileWriter<ComplexInteger> df(filename, writerSchema, 100);
        int64_t re = 3;
        int64_t im = 5;
        for (int i = 0; i < count; ++i, re *= im, im += 3) {
            ComplexInteger c(re, im);
            df.write(c);
        }
        df.close();
    }